

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

char * flatcc_json_parser_union_type_vector
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,
                 flatcc_json_parser_integral_symbol_f **type_parsers,
                 flatcc_json_parser_union_f *union_parser,
                 flatcc_json_parser_is_known_type_f *accept_type)

{
  char *pcVar1;
  flatbuffers_voffset_t id_00;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  void *pvVar4;
  uint8_t *puVar5;
  char *pcVar6;
  size_t sVar7;
  size_t handle_00;
  void *__src;
  flatcc_builder_ref_t *pfVar8;
  char *pcVar9;
  long lVar10;
  undefined6 in_register_00000082;
  char *buf_00;
  uint64_t value;
  uint8_t local_69;
  char *local_68;
  int local_5c;
  int local_58;
  uint local_54;
  uint64_t local_50;
  size_t local_48;
  long local_40;
  long local_38;
  
  local_68 = end;
  pvVar4 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  local_40 = union_index * 5;
  if (*(char *)((long)pvVar4 + union_index * 0x28 + 0x24) != '\0') {
    if (ctx->error != 0) {
      return local_68;
    }
    ctx->error = 0x1c;
    pcVar9 = buf;
    goto LAB_0011f382;
  }
  local_54 = (uint)CONCAT62(in_register_00000082,id);
  lVar10 = (long)pvVar4 + union_index * 0x28 + 0x10;
  *(undefined1 *)((long)pvVar4 + union_index * 0x28 + 0x24) = 1;
  iVar2 = flatcc_builder_start_vector(ctx->ctx,1,1,0xffffffff);
  pcVar9 = local_68;
  if (iVar2 == 0) {
    local_38 = lVar10;
    local_48 = handle;
    if ((buf == local_68) || (*buf != '[')) {
      local_5c = 0;
      pcVar6 = local_68;
      pcVar1 = local_68;
      if (ctx->error == 0) {
        ctx->error = 0x16;
        ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
        ctx->error_loc = buf;
        pcVar6 = local_68;
      }
    }
    else {
      buf_00 = buf + 1;
      if ((long)local_68 - (long)buf_00 < 2) {
LAB_0011f0b3:
        buf_00 = flatcc_json_parser_space_ext(ctx,buf_00,local_68);
      }
      else if (*buf_00 < '!') {
        if ((*buf_00 != ' ') || (buf[2] < '!')) goto LAB_0011f0b3;
        buf_00 = buf + 2;
      }
      pcVar1 = local_68;
      if ((buf_00 == pcVar9) || (*buf_00 != ']')) {
        local_5c = 1;
        pcVar6 = buf_00;
      }
      else {
        local_5c = 0;
        pcVar6 = buf_00 + 1;
        if ((long)pcVar9 - (long)pcVar6 < 2) {
LAB_0011f10d:
          pcVar6 = flatcc_json_parser_space_ext(ctx,pcVar6,pcVar9);
          pcVar1 = local_68;
        }
        else if (*pcVar6 < '!') {
          if ((*pcVar6 != ' ') || (buf_00[2] < '!')) goto LAB_0011f10d;
          pcVar6 = buf_00 + 2;
        }
      }
    }
    while (buf = pcVar6, local_5c != 0) {
      puVar5 = (uint8_t *)flatcc_builder_extend_vector(ctx->ctx,1);
      if (puVar5 == (uint8_t *)0x0) goto LAB_0011f373;
      local_50 = 0;
      local_58 = 0;
      local_69 = '\0';
      pcVar9 = buf;
      if ((buf != pcVar1) &&
         (pcVar6 = flatcc_json_parser_integer(ctx,buf,pcVar1,&local_58,&local_50), pcVar9 = pcVar6,
         pcVar6 != buf)) {
        if (local_58 == 0) {
          if (local_50 < 0x100) {
            local_69 = (uint8_t)local_50;
          }
          else {
            pcVar9 = pcVar1;
            if (ctx->error == 0) {
              ctx->error = 7;
              goto LAB_0011f1c4;
            }
          }
        }
        else {
          pcVar9 = pcVar1;
          if (ctx->error == 0) {
            ctx->error = 8;
LAB_0011f1c4:
            ctx->pos = ((int)pcVar6 - *(int *)&ctx->line_start) + 1;
            ctx->error_loc = pcVar6;
            pcVar9 = pcVar1;
          }
        }
      }
      if ((buf == pcVar9) &&
         ((buf = flatcc_json_parser_symbolic_uint8(ctx,pcVar9,pcVar1,type_parsers,&local_69),
          buf == pcVar9 || (pcVar9 = buf, buf == pcVar1)))) goto LAB_0011f373;
      iVar2 = (*accept_type)(local_69);
      pcVar1 = local_68;
      if (iVar2 == 0) {
        if ((ctx->flags & 1) == 0) {
          if (ctx->error != 0) {
            return local_68;
          }
          ctx->error = 0xf;
          goto LAB_0011f382;
        }
        local_69 = '\0';
      }
      *puVar5 = local_69;
      pcVar6 = flatcc_json_parser_array_end(ctx,pcVar9,local_68,&local_5c);
    }
    sVar7 = flatcc_builder_vector_count(ctx->ctx);
    *(flatbuffers_uoffset_t *)(local_38 + 0x18) = (flatbuffers_uoffset_t)sVar7;
    handle_00 = flatcc_builder_enter_user_frame(ctx->ctx,sVar7 & 0xffffffff);
    pvVar4 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle_00);
    __src = flatcc_builder_vector_edit(ctx->ctx);
    memcpy(pvVar4,__src,sVar7 & 0xffffffff);
    fVar3 = flatcc_builder_end_vector(ctx->ctx);
    if (fVar3 != 0) {
      id_00 = (flatbuffers_voffset_t)local_54;
      pfVar8 = flatcc_builder_table_add_offset(ctx->ctx,(local_54 & 0xffff) - 1);
      if (pfVar8 != (flatcc_builder_ref_t *)0x0) {
        *pfVar8 = fVar3;
        pvVar4 = flatcc_builder_get_user_frame_ptr(ctx->ctx,local_48);
        pcVar6 = local_68;
        *(size_t *)((long)pvVar4 + local_40 * 8 + 0x30) = handle_00;
        pcVar9 = *(char **)((long)pvVar4 + local_40 * 8 + 0x10);
        lVar10 = *(long *)((long)pvVar4 + 8);
        if (pcVar9 == (char *)0x0) {
          *(long *)((long)pvVar4 + 8) = lVar10 + 1;
          return buf;
        }
        if (lVar10 != 0) {
          *(long *)((long)pvVar4 + 8) = lVar10 + -1;
          iVar2 = ctx->line;
          pcVar1 = ctx->line_start;
          ctx->line = *(int *)((long)pvVar4 + local_40 * 8 + 0x20);
          ctx->line_start = *(char **)((long)pvVar4 + local_40 * 8 + 0x18);
          pcVar9 = _parse_union_vector(ctx,pcVar9,local_68,handle_00,(flatbuffers_uoffset_t)sVar7,
                                       id_00,union_parser);
          if (pcVar9 == pcVar6) {
            return pcVar6;
          }
          ctx->line = iVar2;
          ctx->line_start = pcVar1;
          return buf;
        }
        __assert_fail("f->union_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_parser.c"
                      ,0x4d8,
                      "const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *, const char *, const char *, size_t, flatbuffers_voffset_t, size_t, flatcc_json_parser_integral_symbol_f **, flatcc_json_parser_union_f *, flatcc_json_parser_is_known_type_f *)"
                     );
      }
    }
  }
LAB_0011f373:
  if (ctx->error != 0) {
    return local_68;
  }
  ctx->error = 0x23;
  pcVar9 = buf;
LAB_0011f382:
  ctx->pos = ((int)pcVar9 - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = pcVar9;
  return local_68;
}

Assistant:

const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index, flatbuffers_voffset_t id,
        size_t handle,
        flatcc_json_parser_integral_symbol_f *type_parsers[],
        flatcc_json_parser_union_f *union_parser,
        flatcc_json_parser_is_known_type_f accept_type)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    const char *mark;
    int line;
    const char *line_start;
    int more;
    utype_t val;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    utype_t *types;
    size_t size;
    size_t h_types;
    uoffset_t count;

#if FLATBUFFERS_UTYPE_MAX != UINT8_MAX
#error "Update union vector parser to support current union type definition."
#endif

    if (e->type_present) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    e->type_present = 1;
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) goto failed;
    buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
    while (more) {
        if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
        buf = flatcc_json_parser_uint8(ctx, (mark = buf), end, &val);
        if (mark == buf) {
            buf = flatcc_json_parser_symbolic_uint8(ctx, (mark = buf), end, type_parsers, &val);
            if (buf == mark || buf == end) goto failed;
        }
        /* Parse unknown types as NONE */
        if (!accept_type(val)) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
            }
            val = 0;
        }
        flatbuffers_uint8_write_to_pe(pval, val);
        buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
    }
    count = (uoffset_t)flatcc_builder_vector_count(ctx->ctx);
    e->count = count;
    size = count * utype_size;
    /* Store type vector so it is accessible to the table vector parser.  */
    h_types = flatcc_builder_enter_user_frame(ctx->ctx, size);
    types = flatcc_builder_get_user_frame_ptr(ctx->ctx, h_types);
    memcpy(types, flatcc_builder_vector_edit(ctx->ctx), size);
    if (!((ref = flatcc_builder_end_vector(ctx->ctx)))) goto failed;
    if (!(pref = flatcc_builder_table_add_offset(ctx->ctx, id - 1))) goto failed;
    *pref = ref;

    /* Restore union frame after possible invalidation due to types frame allocation. */
    f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    e = f->unions + union_index;

    e->h_types = h_types;
    if (e->backtrace == 0) {
        ++f->union_count;
        return buf;
    }
    FLATCC_ASSERT(f->union_count);
    --f->union_count;
    line = ctx->line;
    line_start = ctx->line_start;
    ctx->line = e->line;
    ctx->line_start = e->line_start;
    /* We must not assign buf here because we are backtracking. */
    if (end == _parse_union_vector(ctx, e->backtrace, end, h_types, count, id, union_parser)) return end;
    /*
     * NOTE: We do not need the user frame anymore, but if we did, it
     * would have to be restored from its handle due to the above parse.
     */
    ctx->line = line;
    ctx->line_start = line_start;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}